

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

void __thiscall rengine::OpenGLRenderer::build(OpenGLRenderer *this,Node *n)

{
  rect2d *this_00;
  vec2 vVar1;
  vec2 vVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  Element *pEVar6;
  vec2 *pvVar7;
  vec2 v;
  bool bVar8;
  uint uVar9;
  Node *pNVar10;
  ulong uVar11;
  long lVar12;
  undefined4 *puVar13;
  mat4 *pmVar14;
  float *pfVar15;
  undefined4 *puVar16;
  undefined1 *puVar17;
  mat4 *pmVar18;
  mat4 *pmVar19;
  int i;
  Element *pEVar20;
  long lVar21;
  byte bVar22;
  vec2 *pvVar23;
  byte bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar29;
  vec2 vVar28;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  vec3 vVar35;
  rect2d rVar36;
  mat4 in_stack_fffffffffffffe78;
  mat4 local_134;
  undefined4 local_f0 [18];
  undefined1 auStack_a8 [8];
  mat4 old;
  Element *local_48;
  vec3 v_00;
  
  bVar24 = 0;
  bVar22 = n->field_0x30;
  switch(bVar22) {
  case 1:
    fVar25 = *(float *)&n[2].super_SignalEmitter.m_buckets;
    if (((fVar25 == 0.0) && (!NAN(fVar25))) || ((this->field_0x1f8 & 1) != 0)) {
      local_48 = (Element *)0x0;
    }
    else {
      this->field_0x1f8 = this->field_0x1f8 | 1;
      this->m_farPlane = *(float *)&n[2].super_SignalEmitter.m_buckets;
      pEVar20 = this->m_elements;
      uVar9 = this->m_elementIndex;
      this->m_elementIndex = uVar9 + 1;
      pEVar20[uVar9].node = n;
      pEVar20[uVar9].z = 0.0;
      local_48 = pEVar20 + uVar9;
      pEVar20[uVar9].field_0x1b = pEVar20[uVar9].field_0x1b | 0x20;
    }
    pmVar19 = &this->m_m2d;
    if ((this->field_0x1f8 & 1) != 0) {
      pmVar19 = &this->m_m3d;
    }
    lVar21 = 0x11;
    pmVar14 = pmVar19;
    pfVar15 = (float *)auStack_a8;
    for (lVar12 = lVar21; lVar12 != 0; lVar12 = lVar12 + -1) {
      *pfVar15 = pmVar14->m[0];
      pmVar14 = (mat4 *)(pmVar14->m + 1);
      pfVar15 = pfVar15 + 1;
    }
    puVar13 = (undefined4 *)&n->field_0x34;
    puVar16 = local_f0;
    for (lVar12 = lVar21; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar16 = *puVar13;
      puVar13 = puVar13 + 1;
      puVar16 = puVar16 + 1;
    }
    puVar13 = local_f0;
    puVar17 = &stack0xfffffffffffffe78;
    for (lVar12 = 0x44; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar17 = *(undefined1 *)puVar13;
      puVar13 = (undefined4 *)((long)puVar13 + 1);
      puVar17 = puVar17 + 1;
    }
    mat4::operator*(&local_134,pmVar19,in_stack_fffffffffffffe78);
    pmVar14 = &local_134;
    pmVar18 = pmVar19;
    for (; lVar21 != 0; lVar21 = lVar21 + -1) {
      pmVar18->m[0] = pmVar14->m[0];
      pmVar14 = (mat4 *)((long)pmVar14 + (ulong)bVar24 * -8 + 4);
      pmVar18 = (mat4 *)((long)pmVar18 + (ulong)bVar24 * -8 + 4);
    }
    for (pNVar10 = n->m_child; pNVar10 != (Node *)0x0; pNVar10 = Node::sibling(pNVar10)) {
      build(this,pNVar10);
    }
    pfVar15 = (float *)auStack_a8;
    for (lVar21 = 0x11; lVar21 != 0; lVar21 = lVar21 + -1) {
      pmVar19->m[0] = *pfVar15;
      pfVar15 = pfVar15 + (ulong)bVar24 * -2 + 1;
      pmVar19 = (mat4 *)((long)pmVar19 + (ulong)bVar24 * -8 + 4);
    }
    if (local_48 == (Element *)0x0) {
      return;
    }
    this->field_0x1f8 = this->field_0x1f8 & 0xfe;
    this->m_farPlane = 0.0;
    *(uint *)&local_48->field_0x18 =
         *(uint *)&local_48->field_0x18 & 0xe0000000 |
         (int)((long)this->m_elements + ((ulong)this->m_elementIndex * 0x20 - (long)local_48) >> 5)
         - 1U & 0x1fffffff;
    return;
  case 2:
    bVar8 = true;
    if (*(float *)&n->field_0x34 <= 1.0 && *(float *)&n->field_0x34 != 1.0) goto LAB_0012075e;
    goto LAB_0012075c;
  case 3:
    iVar4 = *(int *)((long)&n[2].super_SignalEmitter._vptr_SignalEmitter + 4);
    break;
  case 4:
    iVar4 = *(int *)&n->field_0x34;
    break;
  case 5:
    bVar8 = 0.0 < *(float *)((long)&n[1].m_parent + 4);
    goto LAB_0012075e;
  default:
    if (bVar22 - 0x41 < 2) {
      vVar1 = *(vec2 *)&n->field_0x34;
      fVar27 = vVar1.x;
      fVar29 = vVar1.y;
      vVar2 = *(vec2 *)((long)&n[1].super_SignalEmitter._vptr_SignalEmitter + 4);
      fVar25 = vVar2.x;
      fVar26 = vVar2.y;
      if (((fVar25 - fVar27 != 0.0) || (NAN(fVar25 - fVar27))) &&
         ((fVar26 - fVar29 != 0.0 || (NAN(fVar26 - fVar29))))) {
        if (bVar22 == 0x42) {
          if (n[1].m_parent == (Node *)0x0) goto LAB_001206ff;
        }
        else if (*(float *)&n[1].m_child < 0.001) goto LAB_001206ff;
        pEVar20 = this->m_elements;
        uVar9 = this->m_elementIndex;
        pEVar20[uVar9].node = n;
        uVar5 = this->m_vertexIndex;
        pEVar20[uVar9].vboOffset = uVar5;
        pvVar23 = this->m_vertices + uVar5;
        if ((this->field_0x1f8 & 1) == 0) {
          pmVar19 = &this->m_m2d;
          vVar1 = mat4::operator*(pmVar19,vVar1);
          *pvVar23 = vVar1;
          vVar1.y = fVar26;
          vVar1.x = fVar27;
          vVar1 = mat4::operator*(pmVar19,vVar1);
          pvVar23[1] = vVar1;
          v.y = fVar29;
          v.x = fVar25;
          vVar1 = mat4::operator*(pmVar19,v);
          pvVar23[2] = vVar1;
          vVar1 = mat4::operator*(pmVar19,vVar2);
          pvVar23[3] = vVar1;
        }
        else {
          v_00.x = (fVar27 + fVar25) * 0.5;
          v_00.y = (fVar29 + fVar26) * 0.5;
          v_00.z = 0.0;
          vVar35 = mat4::operator*(&this->m_m3d,v_00);
          pEVar20[uVar9].z = vVar35.z;
          projectQuad(this,vVar1,vVar2,pvVar23);
        }
        this->m_vertexIndex = this->m_vertexIndex + 4;
        this->m_elementIndex = this->m_elementIndex + 1;
        if ((this->field_0x1f8 & 2) != 0) {
          for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
            rect2d::operator|=(&this->m_layerBoundingBox,pvVar23[lVar21]);
          }
        }
      }
    }
    else if (bVar22 == 0x43) {
      pEVar20 = this->m_elements;
      uVar9 = this->m_elementIndex;
      this->m_elementIndex = uVar9 + 1;
      pEVar20[uVar9].node = n;
      if ((this->field_0x1f8 & 1) != 0) {
        uVar3 = *(undefined8 *)((long)&n[1].super_SignalEmitter._vptr_SignalEmitter + 4);
        vVar35.x = ((float)uVar3 + (float)*(undefined8 *)&n->field_0x34) * 0.5;
        vVar35.y = ((float)((ulong)uVar3 >> 0x20) +
                   (float)((ulong)*(undefined8 *)&n->field_0x34 >> 0x20)) * 0.5;
        vVar35.z = 0.0;
        vVar35 = mat4::operator*(&this->m_m3d,vVar35);
        pEVar20[uVar9].z = vVar35.z;
      }
    }
LAB_001206ff:
    for (pNVar10 = n->m_child; pNVar10 != (Node *)0x0; pNVar10 = Node::sibling(pNVar10)) {
      build(this,pNVar10);
    }
    return;
  }
  bVar8 = true;
  if (iVar4 == 0) {
LAB_0012075c:
    bVar8 = false;
  }
LAB_0012075e:
  bVar22 = this->field_0x1f8;
  auStack_a8 = *(undefined1 (*) [8])&(this->m_layerBoundingBox).tl;
  old.m._0_8_ = (this->m_layerBoundingBox).br;
  if (bVar8) {
    this->field_0x1f8 = bVar22 | 2;
    pEVar6 = this->m_elements;
    uVar9 = this->m_elementIndex;
    this->m_elementIndex = uVar9 + 1;
    pEVar20 = pEVar6 + uVar9;
    pEVar6[uVar9].node = n;
    *(uint *)&pEVar6[uVar9].field_0x18 =
         ((byte)this->field_0x1f8 & 1) * 0x20000000 +
         (*(uint *)&pEVar6[uVar9].field_0x18 & 0x9fffffff) + 0x40000000;
    (this->m_layerBoundingBox).tl.x = INFINITY;
    (this->m_layerBoundingBox).tl.y = INFINITY;
    (this->m_layerBoundingBox).br.x = -INFINITY;
    (this->m_layerBoundingBox).br.y = -INFINITY;
  }
  else {
    pEVar20 = (Element *)0x0;
  }
  bVar22 = bVar22 & 2;
  this_00 = &this->m_layerBoundingBox;
  for (pNVar10 = n->m_child; pNVar10 != (Node *)0x0; pNVar10 = Node::sibling(pNVar10)) {
    build(this,pNVar10);
  }
  if (pEVar20 != (Element *)0x0) {
    this->field_0x1f8 = this->field_0x1f8 & 0xfd | bVar22;
    *(uint *)&pEVar20->field_0x18 =
         *(uint *)&pEVar20->field_0x18 & 0xe0000000 |
         (int)((long)this->m_elements + ((ulong)this->m_elementIndex * 0x20 - (long)pEVar20) >> 5) -
         1U & 0x1fffffff;
    pEVar20->vboOffset = this->m_vertexIndex;
    rVar36 = rect2d::aligned(this_00);
    fVar25 = rVar36.tl.x;
    fVar26 = rVar36.tl.y;
    pvVar7 = this->m_vertices;
    uVar11 = (ulong)this->m_vertexIndex;
    pvVar7[uVar11] = rVar36.tl;
    fVar27 = rVar36.br.x;
    fVar29 = rVar36.br.y;
    pvVar23 = pvVar7 + uVar11 + 1;
    pvVar23->x = fVar25;
    pvVar23->y = fVar29;
    pvVar23[1].x = fVar27;
    pvVar23[1].y = fVar26;
    pvVar7[uVar11 + 3] = rVar36.br;
    this->m_vertexIndex = this->m_vertexIndex + 4;
    if ((*(uint *)&n->field_0x30 & 0xfe) == 4) {
      fVar32 = (float)*(uint *)&n->field_0x34;
      fVar30 = fVar26 + -1.0;
      fVar31 = fVar29 + 1.0;
      fVar33 = fVar25 - fVar32;
      fVar34 = fVar27 + fVar32;
      pvVar7[uVar11 + 4].x = fVar33;
      pvVar7[uVar11 + 4].y = fVar30;
      pvVar7[uVar11 + 5].x = fVar33;
      pvVar7[uVar11 + 5].y = fVar31;
      pvVar7[uVar11 + 6].x = fVar34;
      pvVar7[uVar11 + 6].y = fVar30;
      pvVar7[uVar11 + 7].x = fVar34;
      pvVar7[uVar11 + 7].y = fVar31;
      pvVar7[uVar11 + 8].x = fVar33;
      pvVar7[uVar11 + 8].y = fVar26 - fVar32;
      pvVar7[uVar11 + 9].x = fVar33;
      pvVar7[uVar11 + 9].y = fVar29 + fVar32;
      pvVar7[uVar11 + 10].x = fVar34;
      pvVar7[uVar11 + 10].y = fVar26 - fVar32;
      pvVar7[uVar11 + 0xb].x = fVar34;
      pvVar7[uVar11 + 0xb].y = fVar29 + fVar32;
      this->m_vertexIndex = this->m_vertexIndex + 8;
      if (n->field_0x30 == '\x05') {
        vVar2.y = fVar30;
        vVar2.x = fVar25 + -1.0;
        pvVar7[uVar11 + 0xc] = vVar2;
        pvVar7[uVar11 + 0xd].x = fVar25 + -1.0;
        pvVar7[uVar11 + 0xd].y = fVar31;
        vVar28.x = fVar27 + 1.0;
        pvVar7[uVar11 + 0xe].x = vVar28.x;
        pvVar7[uVar11 + 0xe].y = fVar30;
        vVar28.y = fVar31;
        pvVar7[uVar11 + 0xf] = vVar28;
      }
    }
    if (bVar22 != 0) {
      rect2d::operator|=((rect2d *)auStack_a8,this->m_layerBoundingBox);
    }
    (this_00->tl).x = (float)auStack_a8._0_4_;
    (this_00->tl).y = (float)auStack_a8._4_4_;
    (this->m_layerBoundingBox).br.x = old.m[0];
    (this->m_layerBoundingBox).br.y = old.m[1];
    if ((this->field_0x1f8 & 1) != 0) {
      uVar9 = *(uint *)&pEVar20->field_0x18 & 0x1fffffff;
      fVar25 = 0.0;
      for (lVar21 = 0; (ulong)uVar9 * 0x20 + 0x20 != lVar21; lVar21 = lVar21 + 0x20) {
        fVar25 = fVar25 + *(float *)((long)&pEVar20->z + lVar21);
      }
      pEVar20->z = fVar25 / (float)uVar9;
    }
  }
  return;
}

Assistant:

inline void OpenGLRenderer::build(Node *n)
{
    switch (n->type()) {
    case Node::TextureNodeType:
    case Node::RectangleNodeType: {
        rect2d geometry = static_cast<RectangleNodeBase *>(n)->geometry();

        // Skip if empty..
        if (geometry.width() == 0 || geometry.height() == 0
            || (n->type() == Node::TextureNodeType && static_cast<TextureNode *>(n)->texture() == 0)
            || (n->type() == Node::RectangleNodeType && static_cast<RectangleNode *>(n)->color().w < RENGINE_RENDERER_ALPHA_THRESHOLD))
            break;

        Element *e = m_elements + m_elementIndex;
        e->node = n;
        e->vboOffset = m_vertexIndex;
        vec2 p1 = geometry.tl;
        vec2 p2 = geometry.br;
        vec2 *v = m_vertices + m_vertexIndex;

        // std::cout << " -- building rect from " << p1 << " " << p2 << " into " << m_vertices << " " << e << std::endl;

        if (m_render3d) {
            e->z = (m_m3d * vec3((p1 + p2) / 2.0f)).z;
            projectQuad(p1, p2, v);

        } else {
            v[0] = m_m2d * p1;
            v[1] = m_m2d * vec2(p1.x, p2.y);
            v[2] = m_m2d * vec2(p2.x, p1.y);
            v[3] = m_m2d * p2;
        }
        m_vertexIndex += 4;
        m_elementIndex += 1;

        // Add to the bounding box if we're in inside a layer
        if (m_layered) {
            for (int i=0; i<4; ++i)
                m_layerBoundingBox |= v[i];
            // std::cout << " ----> bounds: " << m_layerBoundingBox << std::endl;
        }

    } break;

    case Node::TransformNodeType: {
        TransformNode *tn = static_cast<TransformNode *>(n);

        Element *e = 0;

        if (tn->projectionDepth() && !m_render3d) {
            m_render3d = true;
            m_farPlane = tn->projectionDepth();
            e = m_elements + m_elementIndex++;
            e->node = n;
            e->z = 0;
            e->projection = true;
        }

        mat4 *m = m_render3d ? &m_m3d : &m_m2d;
        mat4 old = *m;
        *m = *m * tn->matrix();

        for (Node *c = n->child(); c; c = c->sibling())
            build(c);

        // restore previous state
        *m = old;
        if (e) {
            m_render3d = false;
            m_farPlane = 0;
            e->groupSize = (m_elements + m_elementIndex) - e - 1;
        }
    } return;

    // all layered node types take this code path
    case Node::ShadowNodeType:
    case Node::BlurNodeType:
    case Node::ColorFilterNodeType:
    case Node::OpacityNodeType: {

        bool useTexture =
            (n->type() == Node::OpacityNodeType && static_cast<OpacityNode *>(n)->opacity() < 1.0f)
            || (n->type() == Node::ColorFilterNodeType && !static_cast<ColorFilterNode *>(n)->colorMatrix().isIdentity())
            || (n->type() == Node::BlurNodeType && static_cast<BlurNode *>(n)->radius() > 0)
            || (n->type() == Node::ShadowNodeType && static_cast<ShadowNode *>(n)->color().w > 0);

        bool storedTextureed = m_layered;
        Element *e = 0;
        rect2d storedBox = m_layerBoundingBox;

        if (useTexture) {
            m_layered = true;
            e = m_elements + m_elementIndex++;
            e->node = n;
            e->projection = m_render3d;
            e->layered = true;
            const float inf = std::numeric_limits<float>::infinity();
            m_layerBoundingBox = rect2d(inf, inf, -inf, -inf);
        }
        // std::cout << " -- building layered node into " << e << std::endl;

        for (Node *c = n->child(); c; c = c->sibling())
            build(c);

        if (e) {
            m_layered = storedTextureed;
            e->groupSize = (m_elements + m_elementIndex) - e - 1;
            // std::cout << "groupSize of " << e << " is " << e->groupSize << " based on: " << m_elements << " " << m_elementIndex << " " << e << std::endl;
            e->vboOffset = m_vertexIndex;
            rect2d box = m_layerBoundingBox.aligned();
            vec2 *v = m_vertices + m_vertexIndex;
            v[0] = box.tl;
            v[1] = vec2(box.left(), box.bottom());
            v[2] = vec2(box.right(), box.top());
            v[3] = box.br;
            m_vertexIndex += 4;

            if (n->type() == Node::BlurNodeType || n->type() == Node::ShadowNodeType) {
                float radius = n->type() == Node::BlurNodeType
                               ? static_cast<BlurNode *>(n)->radius()
                               : static_cast<ShadowNode *>(n)->radius();
                float t1 = box.tl.y - 1;
                float b1 = box.br.y + 1;
                vec2 tlr = box.tl - vec2(radius);
                vec2 brr = box.br + vec2(radius);
                v[ 4] = vec2(tlr.x, t1);
                v[ 5] = vec2(tlr.x, b1);
                v[ 6] = vec2(brr.x, t1);
                v[ 7] = vec2(brr.x, b1);
                v[ 8] = vec2(tlr.x, tlr.y);
                v[ 9] = vec2(tlr.x, brr.y);
                v[10] = vec2(brr.x, tlr.y);
                v[11] = vec2(brr.x, brr.y);
                m_vertexIndex += 8;

                if (n->type() == Node::ShadowNodeType) {
                    v[12] = box.tl - 1.0;
                    v[13] = vec2(box.left() - 1, box.bottom() + 1);
                    v[14] = vec2(box.right() + 1, box.top() - 1);
                    v[15] = box.br + 1;
                }
            }

            // We're a nested layer, accumulate the layered bounding box into
            // the stored one..
            if (storedTextureed)
                storedBox |= m_layerBoundingBox;

            m_layerBoundingBox = storedBox;
            if (m_render3d) {
                // Let the opacity layer's z be the average of all its children..
                float z = 0;
                for (unsigned i=0; i<=e->groupSize; ++i)
                    z += (e+i)->z;
                e->z = z / e->groupSize;
            }
        }

    } return;

    case Node::RenderNodeType: {
        Element *e = m_elements + m_elementIndex++;
        e->node = n;
        rect2d geometry = static_cast<RectangleNodeBase *>(n)->geometry();
        vec2 p1 = geometry.tl;
        vec2 p2 = geometry.br;
        // This will "kinda" work. As long as our 3d support is based on back-
        // to-front ordering of the center of primitives, we might as well
        // order render nodes back-to-front as well. The usercase is a bit
        // broken though..
        if (m_render3d)
            e->z = (m_m3d * vec3((p1 + p2) / 2.0f)).z;
        break;
    }

    default:
        break;
    }

    for (Node *c = n->child(); c; c = c->sibling())
        build(c);


}